

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarDateValidator::handleKeyEvent
          (QCalendarDateValidator *this,QKeyEvent *keyEvent,QCalendar cal)

{
  long lVar1;
  uint uVar2;
  Section SVar3;
  reference pvVar4;
  QKeyEvent *in_RSI;
  QCalendarDateValidator *in_RDI;
  long in_FS_OFFSET;
  int key;
  undefined4 in_stack_ffffffffffffffd0;
  QCalendarDateValidator *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_RDI->m_currentToken) {
    this_00 = in_RDI;
    uVar2 = QKeyEvent::key(in_RSI);
    if ((in_RDI->m_lastSectionMove == NextSection) && ((uVar2 == 0x1000061 || (uVar2 == 0x1000003)))
       ) {
      toPreviousToken((QCalendarDateValidator *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    }
    if (uVar2 == 0x1000014) {
      toNextToken((QCalendarDateValidator *)CONCAT44(0x1000014,in_stack_ffffffffffffffd0));
    }
    else if (uVar2 == 0x1000012) {
      toPreviousToken((QCalendarDateValidator *)CONCAT44(0x1000012,in_stack_ffffffffffffffd0));
    }
    pvVar4 = std::vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::
             operator[]((vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_> *
                        )this_00,(size_type)in_RSI);
    SVar3 = (*pvVar4->validator->_vptr_QCalendarDateSectionValidator[2])
                      (pvVar4->validator,(ulong)uVar2);
    in_RDI->m_lastSectionMove = SVar3;
    applyToDate(in_RDI,this._0_1_);
    if (in_RDI->m_lastSectionMove == NextSection) {
      toNextToken((QCalendarDateValidator *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    }
    else if (in_RDI->m_lastSectionMove == PrevSection) {
      toPreviousToken((QCalendarDateValidator *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarDateValidator::handleKeyEvent(QKeyEvent *keyEvent,QCalendar cal)
{
    if (m_currentToken < 0)
        return;

    int key = keyEvent->key();
    if (m_lastSectionMove == QCalendarDateSectionValidator::NextSection) {
        if (key == Qt::Key_Back || key == Qt::Key_Backspace)
            toPreviousToken();
    }
    if (key == Qt::Key_Right)
        toNextToken();
    else if (key == Qt::Key_Left)
        toPreviousToken();

    m_lastSectionMove = m_tokens[m_currentToken].validator->handleKey(key);

    applyToDate(cal);
    if (m_lastSectionMove == QCalendarDateSectionValidator::NextSection)
        toNextToken();
    else if (m_lastSectionMove == QCalendarDateSectionValidator::PrevSection)
        toPreviousToken();
}